

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrasalrule.h
# Opt level: O3

void jhu::thrax::printRhs<false>(ostream *out,PhrasalRule *rule)

{
  char *pcVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  NT *pNVar5;
  ostream *poVar6;
  long lVar7;
  ulong uVar8;
  Rhs *__range2;
  int iVar9;
  PhrasalRule *pPVar10;
  NT *pNVar11;
  NT *pNVar12;
  short sVar13;
  Span SVar14;
  Rhs nts;
  char local_b9;
  int local_b8;
  Span local_b4;
  Span local_b0;
  int local_ac;
  NT *local_a8;
  AlignedSentencePair *local_a0;
  size_t local_98;
  NT local_90 [4];
  
  local_a0 = rule->sentence;
  pPVar10 = rule;
  pNVar5 = local_90;
  for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
    pNVar5->span = (pPVar10->nts)._M_elems[0].span;
    pPVar10 = (PhrasalRule *)&(pPVar10->nts)._M_elems[0].label;
    pNVar5 = (NT *)&pNVar5->label;
  }
  pNVar5 = std::
           __find_if<jhu::thrax::NT*,__gnu_cxx::__ops::_Iter_pred<jhu::thrax::printRhs<false>(std::ostream&,jhu::thrax::PhrasalRule_const&)::_lambda(auto:1_const&)_1_>>
                     (local_90,&stack0xffffffffffffffd0);
  if (local_90 != pNVar5) {
    uVar8 = ((long)pNVar5 - (long)local_90 >> 3) * -0x5555555555555555;
    lVar7 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<jhu::thrax::NT*,long,__gnu_cxx::__ops::_Iter_comp_iter<jhu::thrax::printRhs<false>(std::ostream&,jhu::thrax::PhrasalRule_const&)::_lambda(auto:1,auto:2)_1_>>
              (local_90,pNVar5,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<jhu::thrax::NT*,__gnu_cxx::__ops::_Iter_comp_iter<jhu::thrax::printRhs<false>(std::ostream&,jhu::thrax::PhrasalRule_const&)::_lambda(auto:1,auto:2)_1_>>
              (local_90,pNVar5);
  }
  SVar14 = (rule->lhs).span.tgt;
  iVar9 = (int)SVar14 >> 0x10;
  iVar4 = (int)SVar14.start;
  if (iVar4 < iVar9) {
    local_b0 = local_90[0].span.tgt;
    local_b4 = (Span)((uint)local_90[0].span.tgt >> 0x10);
    pNVar11 = local_90;
    local_b8 = iVar4;
    local_ac = iVar9;
    local_a8 = pNVar5;
    do {
      sVar13 = SVar14.start;
      if ((pNVar11 == pNVar5) || (sVar13 < local_b0.start)) {
        if (local_b8 != iVar4) {
          local_b9 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>(out,&local_b9,1);
        }
        pbVar2 = (local_a0->tgt).
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,pbVar2[sVar13]._M_str,pbVar2[sVar13]._M_len);
        pNVar12 = pNVar11;
        SVar14 = (Span)((int)SVar14 + 1);
      }
      else {
        if ((local_b8 != iVar4) && (local_b8 != local_b0.start)) {
          local_b9 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>(out,&local_b9,1);
        }
        local_98 = (pNVar11->label)._M_len;
        pcVar1 = (pNVar11->label)._M_str;
        iVar9 = 1;
        lVar7 = 0;
        do {
          bVar3 = SpanPair::operator==
                            ((SpanPair *)((long)&(rule->nts)._M_elems[0].span.src.start + lVar7),
                             pNVar11->span);
          if (bVar3) goto LAB_001055a3;
          iVar9 = iVar9 + 1;
          lVar7 = lVar7 + 0x18;
        } while (lVar7 != 0x60);
        iVar9 = 0;
LAB_001055a3:
        local_b9 = '[';
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(out,&local_b9,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar1,local_98);
        if (iVar9 != 0) {
          local_b9 = ',';
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(out,&local_b9,1);
          std::ostream::operator<<(poVar6,iVar9);
        }
        local_b9 = ']';
        std::__ostream_insert<char,std::char_traits<char>>(out,&local_b9,1);
        pNVar12 = pNVar11 + 1;
        pNVar5 = local_a8;
        SVar14 = local_b4;
        iVar9 = local_ac;
        if (pNVar12 < local_a8) {
          local_b0 = pNVar11[1].span.tgt;
          local_b4 = (Span)((uint)local_b0 >> 0x10);
        }
      }
      iVar4 = (int)SVar14.start;
      pNVar11 = pNVar12;
    } while (iVar4 < iVar9);
  }
  return;
}

Assistant:

inline void printRhs(std::ostream& out, const PhrasalRule& rule) {
  const auto& s = rule.sentence;
  constexpr auto empty = [](const auto& nt) { return nt.span.empty(); };
  auto nts = rule.nts;
  auto it = std::find_if(nts.begin(), nts.end(), empty);
  if constexpr (!SourceSide) {
    std::sort(
        nts.begin(),
        it,
        [](auto a, auto b) { return a.span.tgt.start < b.span.tgt.start; });
  }
  auto nt = nts.begin();
  auto [start, end] = rule.lhs.span.get<SourceSide>();
  auto [ntStart, ntEnd] = nt->span.get<SourceSide>();
  for (auto i = start; i < end; i++) {
    if (nt == it || i < ntStart) {
      if (i != start) {
        out << ' ';
      }
      if constexpr (SourceSide) {
        out << s.src[i];
      } else {
        out << s.tgt[i];
      }
    } else {
      if (i != start && ntStart != start) {
        out << ' ';
      }
      bracket(out, nt->label, rule.ntIndex(*nt));
      i = ntEnd - 1;
      nt++;
      if (nt < it) {
        auto [s, e] = nt->span.get<SourceSide>();
        ntStart = s;
        ntEnd = e;
      }
    }
  }
}